

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineFiller.cc
# Opt level: O0

vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
* __thiscall
LineFiller::fill_all_paths
          (LineFiller *this,
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          *lines)

{
  ulong uVar1;
  size_type sVar2;
  ostream *this_00;
  ostream *__x;
  ostream *this_01;
  void *this_02;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *in_RDX;
  long in_RSI;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *in_RDI;
  vector<long,_std::allocator<long>_> *in_stack_00000060;
  LineFiller *in_stack_00000068;
  value_type line;
  int l;
  int total_ready;
  size_type in_stack_ffffffffffffff58;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffff88;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffff90;
  int local_20;
  int local_1c;
  
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::size(in_RDX);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::resize(in_RDX,in_stack_ffffffffffffff58);
  local_1c = 0;
  local_20 = 0;
  while( true ) {
    uVar1 = (ulong)local_20;
    sVar2 = std::
            vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            ::size(in_RDX);
    if (sVar2 <= uVar1) break;
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::operator[](in_RDX,(long)local_20);
    std::vector<long,_std::allocator<long>_>::vector
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    this_00 = std::operator<<((ostream *)&std::cout,"Processing line ");
    __x = (ostream *)std::ostream::operator<<(this_00,local_1c);
    this_01 = std::operator<<(__x,"/");
    sVar2 = std::
            vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            ::size(in_RDX);
    this_02 = (void *)std::ostream::operator<<(this_01,sVar2);
    std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
    std::vector<long,_std::allocator<long>_>::vector
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    line_fill(in_stack_00000068,in_stack_00000060);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::operator[]((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  *)(in_RSI + 0x10),(long)local_20);
    std::vector<long,_std::allocator<long>_>::operator=
              ((vector<long,_std::allocator<long>_> *)this_00,
               (vector<long,_std::allocator<long>_> *)__x);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)this_00);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)this_00);
    local_1c = local_1c + 1;
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)this_00);
    local_20 = local_20 + 1;
  }
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)in_stack_ffffffffffffff90,
           (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)in_stack_ffffffffffffff88);
  return in_RDI;
}

Assistant:

std::vector<std::vector<sgNodeID_t >> LineFiller::fill_all_paths(std::vector<std::vector<sgNodeID_t >> lines){

    final_lines.resize(lines.size());
    auto total_ready = 0;
#pragma omp parallel for
    for (auto l=0; l<lines.size(); ++l){
        auto line = lines[l];
        std::cout << "Processing line " << total_ready << "/" << lines.size() <<std::endl;
        final_lines[l] = line_fill(line);
        total_ready++;
    }
    return final_lines;
}